

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O3

void __thiscall
AddPointBlock<3U>::operator()
          (AddPointBlock<3U> *this,int gid,Bounds *core,Bounds *param_3,Bounds *domain,RCLink *link)

{
  PointBlock<3U> *this_00;
  RegularLink<diy::Bounds<float>_> *this_01;
  
  this_00 = (PointBlock<3U> *)operator_new(0x118);
  PointBlock<3U>::PointBlock(this_00,core);
  this_01 = (RegularLink<diy::Bounds<float>_> *)operator_new(0x1b8);
  diy::RegularLink<diy::Bounds<float>_>::RegularLink(this_01,link);
  diy::Master::add(this->master,gid,this_00,(Link *)this_01);
  PointBlock<3U>::generate_points(this_00,domain,this->num_points);
  return;
}

Assistant:

void  operator()(int gid,                // block global id
                     const Bounds& core,     // block bounds without any ghost added
                     const Bounds&,          // block bounds including any ghost region added
                     const Bounds& domain,   // global data bounds
                     const RCLink& link)     // neighborhood
        const
        {
            Block*          b   = new Block(core);
            RCLink*         l   = new RCLink(link);
            diy::Master&    m   = const_cast<diy::Master&>(master);

            m.add(gid, b, l); // add block to the master (mandatory)

            b->generate_points(domain, num_points); // initialize block data (typical)
        }